

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsObject.c
# Opt level: O0

void JsStandardConstruct(JsObject *self,JsObject *thisobj,int argc,JsValue **argv,JsValue *res)

{
  undefined1 local_50 [8];
  JsValue res0;
  JsObject *this0;
  JsValue *res_local;
  JsValue **argv_local;
  int argc_local;
  JsObject *thisobj_local;
  JsObject *self_local;
  
  res0.u.reference.name = (char *)JsCreateStandardObject((JsObject *)0x0);
  (*self->Get)(self,"prototype",(int *)0x0,(JsValue *)local_50);
  if (local_50._0_4_ == JS_OBJECT) {
    *(undefined8 *)res0.u.reference.name = res0._0_8_;
  }
  (*self->Call)(self,(JsObject *)res0.u.reference.name,argc,argv,res);
  if (res->type != JS_OBJECT) {
    res->type = JS_OBJECT;
    (res->u).number = (double)res0.u.reference.name;
  }
  return;
}

Assistant:

void JsStandardConstruct(struct JsObject *self, struct JsObject *thisobj,
			int argc, struct JsValue **argv, struct JsValue *res){
			
	struct JsObject* this0 = JsCreateStandardObject(NULL);
	struct JsValue res0;
	//获得构造函数的prototype属性
	(*self->Get)(self,"prototype",NULL,&res0);
	if(res0.type == JS_OBJECT)
		this0->Prototype = res0.u.object;
	//Call
	(*self->Call)(self,this0,argc,argv,res);
	if(res->type != JS_OBJECT){
		res->type = JS_OBJECT;
		res->u.object = this0;
	}
}